

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_double<long_double>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
           *this,longdouble value,format_specs *spec)

{
  ulong uVar1;
  byte bVar2;
  alignment aVar3;
  basic_buffer<wchar_t> *pbVar4;
  char *pcVar5;
  size_t sVar6;
  byte bVar7;
  longdouble lVar8;
  float_spec_handler handler;
  align_spec as;
  write_inf_or_nan_t write_inf_or_nan;
  float_spec_handler local_2ba;
  align_spec local_2b8;
  longdouble local_2a8;
  undefined1 local_298 [24];
  double_writer local_280;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> *local_268;
  undefined1 local_260 [16];
  undefined2 local_250;
  byte local_24c;
  buffer local_248;
  char local_228 [504];
  
  local_2ba.type = (spec->super_core_format_specs).type;
  local_2ba.upper = false;
  if ((byte)local_2ba.type < 0x61) {
    switch(local_2ba.type) {
    case 'A':
    case 'E':
    case 'F':
    case 'G':
      local_2ba.upper = true;
      break;
    case 'B':
    case 'C':
    case 'D':
switchD_00202a96_caseD_42:
      local_2a8 = value;
      float_spec_handler::on_error(&local_2ba);
      value = local_2a8;
      break;
    default:
      if (local_2ba.type != 0) goto switchD_00202a96_caseD_42;
LAB_00202ab1:
      local_2ba.type = 0x67;
    }
  }
  else if ((1 < (byte)local_2ba.type - 0x65) && (local_2ba.type != 0x61)) {
    if (local_2ba.type == 0x67) goto LAB_00202ab1;
    goto switchD_00202a96_caseD_42;
  }
  local_298._8_2_ = (undefined2)((unkuint10)value >> 0x40);
  if ((short)local_298._8_2_ < 0) {
    lVar8 = -value;
    bVar7 = 0x2d;
  }
  else {
    bVar2 = (spec->super_core_format_specs).flags;
    lVar8 = value;
    if ((bVar2 & 1) == 0) {
      bVar7 = 0;
    }
    else {
      bVar7 = 0x2b;
      if ((bVar2 & 2) == 0) {
        bVar7 = 0x20;
      }
    }
  }
  local_260._0_4_ = (spec->super_align_spec).width_;
  local_260._4_4_ = (spec->super_align_spec).fill_;
  local_260._8_8_ = *(undefined8 *)&(spec->super_align_spec).align_;
  local_250._0_1_ = (spec->super_core_format_specs).flags;
  local_250._1_1_ = (spec->super_core_format_specs).type;
  local_298._0_10_ = value;
  local_268 = this;
  local_24c = bVar7;
  if (NAN(lVar8)) {
    pcVar5 = "NAN";
    local_248.ptr_ = "nan";
LAB_00202b45:
    if (local_2ba.upper != false) {
      local_248.ptr_ = pcVar5;
    }
    local_248._vptr_basic_buffer = (_func_int **)CONCAT71(local_248._vptr_basic_buffer._1_7_,bVar7);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
    write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::inf_or_nan_writer>
              ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *
               )this,(align_spec *)local_260,(inf_or_nan_writer *)&local_248);
    return;
  }
  if ((longdouble)INFINITY <= lVar8) {
    pcVar5 = "INF";
    local_248.ptr_ = "inf";
    goto LAB_00202b45;
  }
  local_248.size_ = 0;
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_00242788;
  local_248.capacity_ = 500;
  local_248.ptr_ = local_228;
  internal::sprintf_format<long_double>
            (lVar8,&local_248,
             (core_format_specs)
             ((ulong)spec->super_core_format_specs & 0xffff00ffffffffff |
             (ulong)(byte)local_2ba.type << 0x28));
  local_280.n = local_248.size_;
  local_2b8.align_ = (spec->super_align_spec).align_;
  local_2b8.width_ = (spec->super_align_spec).width_;
  local_2b8.fill_ = (spec->super_align_spec).fill_;
  aVar3 = (spec->super_align_spec).align_;
  if (aVar3 == ALIGN_DEFAULT) {
    local_2b8.align_ = ALIGN_RIGHT;
  }
  else if (aVar3 == ALIGN_NUMERIC) {
    if (bVar7 != 0) {
      pbVar4 = (this->out_).container;
      sVar6 = pbVar4->size_;
      uVar1 = sVar6 + 1;
      if (pbVar4->capacity_ < uVar1) {
        local_2a8 = (longdouble)CONCAT28(local_2a8._8_2_,sVar6);
        (**pbVar4->_vptr_basic_buffer)(pbVar4,uVar1);
        sVar6 = local_2a8._0_8_;
      }
      pbVar4->size_ = uVar1;
      pbVar4->ptr_[sVar6] = (uint)bVar7;
      if (local_2b8.width_ != 0) {
        local_2b8.width_ = local_2b8.width_ - 1;
      }
    }
    local_2b8.align_ = ALIGN_RIGHT;
    local_280.sign = 0;
    goto LAB_00202c4b;
  }
  local_280.n = (local_248.size_ + 1) - (ulong)(bVar7 == 0);
  local_280.sign = bVar7;
LAB_00202c4b:
  local_280.buffer = &local_248;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
  write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::double_writer>
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *)
             this,&local_2b8,&local_280);
  local_248._vptr_basic_buffer = (_func_int **)&PTR_grow_00242788;
  if (local_248.ptr_ == local_228) {
    return;
  }
  operator_delete(local_248.ptr_);
  return;
}

Assistant:

void basic_writer<Range>::write_double(T value, const format_specs &spec) {
  // Check type.
  float_spec_handler handler(static_cast<char>(spec.type));
  internal::handle_float_type_spec(handler.type, handler);

  char sign = 0;
  // Use signbit instead of value < 0 because the latter is always
  // false for NaN.
  if (std::signbit(value)) {
    sign = '-';
    value = -value;
  } else if (spec.has(SIGN_FLAG)) {
    sign = spec.has(PLUS_FLAG) ? '+' : ' ';
  }

  struct write_inf_or_nan_t {
    basic_writer &writer;
    format_specs spec;
    char sign;
    void operator()(const char *str) const {
      writer.write_padded(spec, inf_or_nan_writer{sign, str});
    }
  } write_inf_or_nan = {*this, spec, sign};

  // Format NaN and ininity ourselves because sprintf's output is not consistent
  // across platforms.
  if (internal::fputil::isnotanumber(value))
    return write_inf_or_nan(handler.upper ? "NAN" : "nan");
  if (internal::fputil::isinfinity(value))
    return write_inf_or_nan(handler.upper ? "INF" : "inf");

  memory_buffer buffer;
  bool use_grisu = FMT_USE_GRISU && sizeof(T) <= sizeof(double) &&
      spec.type != 'a' && spec.type != 'A' &&
      internal::grisu2_format(static_cast<double>(value), buffer, spec);
  if (!use_grisu) {
    format_specs normalized_spec(spec);
    normalized_spec.type = handler.type;
    internal::sprintf_format(value, buffer, normalized_spec);
  }
  size_t n = buffer.size();
  align_spec as = spec;
  if (spec.align() == ALIGN_NUMERIC) {
    if (sign) {
      auto &&it = reserve(1);
      *it++ = static_cast<char_type>(sign);
      sign = 0;
      if (as.width_)
        --as.width_;
    }
    as.align_ = ALIGN_RIGHT;
  } else {
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    if (sign)
      ++n;
  }
  write_padded(as, double_writer{n, sign, buffer});
}